

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

json_t * json_array_get(json_t *json,size_t index)

{
  if (((json != (json_t *)0x0) && (json->type == JSON_ARRAY)) && (index < json[1].refcount)) {
    return *(json_t **)(*(long *)(json + 2) + index * 8);
  }
  return (json_t *)0x0;
}

Assistant:

json_t *json_array_get(const json_t *json, size_t index)
{
	json_array_t *array;
	if (!json_is_array(json))
		return NULL;
	array = json_to_array(json);

	if (index >= array->entries)
		return NULL;

	return array->table[index];
}